

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

int64_t __thiscall fasttext::Vector::argmax(Vector *this)

{
  float fVar1;
  undefined1 auVar2 [16];
  int64_t iVar3;
  int64_t i;
  long lVar4;
  float fVar5;
  undefined1 auVar6 [64];
  
  auVar6 = ZEXT464((uint)*this->data_);
  iVar3 = 0;
  for (lVar4 = 1; lVar4 < this->m_; lVar4 = lVar4 + 1) {
    fVar1 = this->data_[lVar4];
    fVar5 = auVar6._0_4_;
    auVar2 = vmaxss_avx(ZEXT416((uint)fVar1),auVar6._0_16_);
    auVar6 = ZEXT1664(auVar2);
    if (fVar5 < fVar1) {
      iVar3 = lVar4;
    }
  }
  return iVar3;
}

Assistant:

int64_t Vector::argmax() {
  real max = data_[0];
  int64_t argmax = 0;
  for (int64_t i = 1; i < m_; i++) {
    if (data_[i] > max) {
      max = data_[i];
      argmax = i;
    }
  }
  return argmax;
}